

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLFrameBuffer::addDepthBuffer
          (GLFrameBuffer *this,shared_ptr<polyscope::render::TextureBuffer> *textureBufferIn)

{
  bool bVar1;
  runtime_error *this_00;
  element_type *this_01;
  socklen_t in_ECX;
  sockaddr *__addr;
  int in_ESI;
  shared_ptr<polyscope::render::TextureBuffer> *in_RDI;
  shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer> textureBuffer;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  __shared_ptr local_20 [32];
  
  std::
  dynamic_pointer_cast<polyscope::render::backend_openGL_mock::GLTextureBuffer,polyscope::render::TextureBuffer>
            (in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"tried to bind to non-GL texture buffer");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = std::
            __shared_ptr_access<polyscope::render::backend_openGL_mock::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::backend_openGL_mock::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3fc8fa);
  GLTextureBuffer::bind(this_01,in_ESI,__addr,in_ECX);
  (**(code **)&((in_RDI->
                super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->sizeX)();
  uVar2 = 1;
  checkGLError(true);
  checkGLError(SUB41(uVar2,0));
  this_02 = &in_RDI[8].
             super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::shared_ptr<polyscope::render::TextureBuffer>::
  shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer,void>
            ((shared_ptr<polyscope::render::TextureBuffer> *)this_02,
             (shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer> *)
             CONCAT44(uVar2,in_stack_ffffffffffffff98));
  std::
  vector<std::shared_ptr<polyscope::render::TextureBuffer>,_std::allocator<std::shared_ptr<polyscope::render::TextureBuffer>_>_>
  ::push_back((vector<std::shared_ptr<polyscope::render::TextureBuffer>,_std::allocator<std::shared_ptr<polyscope::render::TextureBuffer>_>_>
               *)this_02,(value_type *)CONCAT44(uVar2,in_stack_ffffffffffffff98));
  std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x3fc968);
  std::shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer> *)0x3fc972);
  return;
}

Assistant:

void GLFrameBuffer::addDepthBuffer(std::shared_ptr<TextureBuffer> textureBufferIn) {

  // it _better_ be a GL buffer
  std::shared_ptr<GLTextureBuffer> textureBuffer = std::dynamic_pointer_cast<GLTextureBuffer>(textureBufferIn);
  if (!textureBuffer) throw std::runtime_error("tried to bind to non-GL texture buffer");

  textureBuffer->bind();
  bind();
  checkGLError();

  // Sanity checks
  // if (depthRenderBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to render buffer");
  // if (depthTextureBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to texture buffer");

  checkGLError();
  textureBuffersDepth.push_back(textureBuffer);
}